

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void put8bitcmaptile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                    int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  int samplesperpixel;
  uint32_t **PALmap;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  ppuVar2 = img->PALmap;
  uVar1 = img->samplesperpixel;
  _y_local = cp;
  for (PALmap._0_4_ = h; w_local = w, (uint32_t)PALmap != 0; PALmap._0_4_ = (uint32_t)PALmap - 1) {
    for (; w_local != 0; w_local = w_local - 1) {
      *_y_local = *ppuVar2[*pp];
      pp = pp + (int)(uint)uVar1;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    pp = pp + fromskew;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put8bitcmaptile)
{
    uint32_t **PALmap = img->PALmap;
    int samplesperpixel = img->samplesperpixel;

    (void)y;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = PALmap[*pp][0];
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}